

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucci.cpp
# Opt level: O2

CommEnum BootLine(void)

{
  int iVar1;
  char *__s1;
  
  while( true ) {
    __s1 = ReadInput();
    if (__s1 != (char *)0x0) break;
    Idle();
  }
  iVar1 = strcmp(__s1,"ucci");
  return (uint)(iVar1 == 0) * 3;
}

Assistant:

CommEnum BootLine(void) {
    const char *LineStr;
    LineStr = ReadInput();
    while (LineStr == NULL) {
        Idle();
        LineStr = ReadInput();
    }
    if (strcmp(LineStr, "ucci") == 0) {
        return e_CommUcci;
    } else {
        return e_CommNone;
    }
}